

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O3

void __thiscall CTB<RemSP>::FirstScan(CTB<RemSP> *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  Mat1i *pMVar5;
  Mat1b *pMVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint j;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  undefined4 uVar21;
  long lVar22;
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar6->field_0x8;
  uVar14 = (ulong)iVar3;
  if (0 < (long)uVar14) {
    uVar4 = *(uint *)&pMVar6->field_0xc;
    lVar9 = (long)(int)uVar4;
    uVar17 = 0;
    do {
      if (0 < (int)uVar4) {
        pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        lVar18 = **(long **)&pMVar6->field_0x48;
        lVar22 = lVar18 * uVar17 + *(long *)&pMVar6->field_0x10;
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar19 = lVar22 - lVar18;
        lVar18 = lVar18 + lVar22;
        lVar7 = *(long *)&pMVar5->field_0x10;
        lVar8 = **(long **)&pMVar5->field_0x48;
        lVar1 = lVar7 + lVar8 * uVar17;
        lVar16 = lVar1 - lVar8;
        lVar2 = lVar8 + lVar1;
        lVar10 = lVar8 + lVar1 + -4;
        uVar12 = uVar17 | 1;
        uVar21 = 0xffffffff;
        uVar13 = 0;
        iVar20 = -1;
        do {
          switch(uVar21) {
          case 1:
            if (*(char *)(lVar22 + uVar13) != '\0') {
              if (uVar17 == 0) {
LAB_001b38c4:
                RemSP::P_[RemSP::length_] = RemSP::length_;
                uVar15 = RemSP::length_ + 1;
                *(uint *)(lVar1 + uVar13 * 4) = RemSP::length_;
                RemSP::length_ = uVar15;
LAB_001b38e7:
                iVar20 = 6;
              }
              else if (*(char *)(lVar19 + uVar13) == '\0') {
                if ((lVar9 <= (long)(uVar13 + 1)) || (*(char *)(lVar19 + uVar13 + 1) == '\0')) {
                  if ((uVar13 == 0) || (*(char *)((uVar13 - 1) + lVar19) == '\0'))
                  goto LAB_001b38c4;
                  *(undefined4 *)(lVar1 + uVar13 * 4) = *(undefined4 *)(lVar16 + -4 + uVar13 * 4);
                  goto LAB_001b38e7;
                }
                uVar15 = *(uint *)(lVar16 + 4 + uVar13 * 4);
                *(uint *)(lVar1 + uVar13 * 4) = uVar15;
                iVar20 = 5;
                if ((uVar13 != 0) && (*(char *)((uVar13 - 1) + lVar19) != '\0')) {
                  RemSP::Merge(uVar15,*(uint *)(lVar16 + -4 + uVar13 * 4));
                }
              }
              else {
                *(undefined4 *)(lVar1 + uVar13 * 4) = *(undefined4 *)(lVar16 + uVar13 * 4);
                iVar20 = 4;
              }
              uVar21 = 2;
              goto LAB_001b38f3;
            }
            uVar21 = 1;
            if ((uVar12 < uVar14) && (*(char *)(lVar18 + uVar13) != '\0')) {
              RemSP::P_[RemSP::length_] = RemSP::length_;
              uVar15 = RemSP::length_ + 1;
              *(uint *)(lVar2 + uVar13 * 4) = RemSP::length_;
              RemSP::length_ = uVar15;
              uVar21 = 3;
            }
            break;
          case 2:
            if (*(char *)(lVar22 + uVar13) == '\0') goto LAB_001b35ad;
            uVar21 = 2;
LAB_001b355c:
            if (iVar20 == 6) {
LAB_001b3618:
              uVar15 = *(uint *)(lVar1 + -4 + uVar13 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar15;
              iVar20 = 6;
              if (uVar17 != 0) {
LAB_001b362f:
                iVar20 = 6;
                if (((long)(uVar13 + 1) < lVar9) && (*(char *)(lVar19 + uVar13 + 1) != '\0'))
                goto LAB_001b3716;
              }
            }
            else if (iVar20 == 5) {
LAB_001b35ff:
              *(undefined4 *)(lVar1 + uVar13 * 4) = *(undefined4 *)(lVar1 + -4 + uVar13 * 4);
              iVar20 = 5;
              uVar21 = 5;
            }
            else if (iVar20 == 4) {
              uVar15 = *(uint *)(lVar1 + -4 + uVar13 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar15;
              goto joined_r0x001b3382;
            }
LAB_001b38f3:
            if ((uVar12 < uVar14) && (*(char *)(lVar18 + uVar13) != '\0')) {
              *(undefined4 *)(lVar2 + uVar13 * 4) = *(undefined4 *)(lVar1 + uVar13 * 4);
            }
            break;
          case 3:
          case 7:
            if (*(char *)(lVar22 + uVar13) != '\0') {
              if (uVar17 == 0) {
LAB_001b35e2:
                *(undefined4 *)(lVar1 + uVar13 * 4) = *(undefined4 *)(lVar10 + uVar13 * 4);
                iVar20 = 6;
              }
              else if (*(char *)(lVar19 + uVar13) == '\0') {
                if (((long)(uVar13 + 1) < lVar9) && (*(char *)(lVar19 + uVar13 + 1) != '\0')) {
LAB_001b385a:
                  uVar15 = *(uint *)(lVar16 + 4 + uVar13 * 4);
                  *(uint *)(lVar1 + uVar13 * 4) = uVar15;
                  RemSP::Merge(uVar15,*(uint *)(lVar2 + (uVar13 - 1) * 4));
                  iVar20 = 5;
                  if ((uVar13 != 0) && (*(char *)(lVar19 + -1 + uVar13) != '\0')) {
                    RemSP::Merge(*(uint *)(lVar1 + uVar13 * 4),*(uint *)(lVar16 + -4 + uVar13 * 4));
                  }
                }
                else {
                  iVar20 = 6;
                  uVar15 = *(uint *)(lVar2 + (uVar13 - 1) * 4);
                  *(uint *)(lVar1 + uVar13 * 4) = uVar15;
                  if ((uVar13 != 0) && (*(char *)(lVar19 + -1 + uVar13) != '\0')) {
                    j = *(uint *)(lVar16 + -4 + uVar13 * 4);
LAB_001b394e:
                    iVar20 = 6;
                    RemSP::Merge(uVar15,j);
                  }
                }
              }
              else {
LAB_001b34db:
                uVar15 = *(uint *)(lVar16 + uVar13 * 4);
                *(uint *)(lVar1 + uVar13 * 4) = uVar15;
                RemSP::Merge(uVar15,*(uint *)(lVar10 + uVar13 * 4));
                iVar20 = 4;
              }
LAB_001b35f4:
              uVar21 = 8;
              goto LAB_001b38f3;
            }
            goto LAB_001b351e;
          case 4:
            if (*(char *)(lVar22 + uVar13) != '\0') {
              uVar21 = 4;
              if (iVar20 == 6) goto LAB_001b3618;
              if (iVar20 == 5) goto LAB_001b35ff;
              if (iVar20 != 4) goto LAB_001b38f3;
              uVar15 = *(uint *)(lVar1 + -4 + uVar13 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar15;
joined_r0x001b3382:
              iVar20 = 6;
              uVar21 = 4;
              if (uVar17 != 0) {
                uVar21 = 4;
                if (*(char *)(lVar19 + uVar13) == '\0') goto LAB_001b362f;
                iVar20 = 4;
              }
              goto LAB_001b38f3;
            }
            goto LAB_001b35ad;
          case 5:
            if (*(char *)(lVar22 + uVar13) != '\0') {
              uVar15 = *(uint *)(lVar1 + -4 + uVar13 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar15;
              if (uVar17 == 0) {
LAB_001b36e0:
                iVar20 = 6;
              }
              else {
                iVar20 = 4;
                if (*(char *)(lVar19 + uVar13) == '\0') {
                  if (lVar9 <= (long)(uVar13 + 1)) goto LAB_001b36e0;
                  iVar20 = 6;
                  if (*(char *)(lVar19 + uVar13 + 1) != '\0') {
                    RemSP::Merge(uVar15,*(uint *)(lVar16 + 4 + uVar13 * 4));
                    iVar20 = 5;
                  }
                }
              }
              uVar21 = 4;
              goto LAB_001b38f3;
            }
            goto LAB_001b35ad;
          case 6:
            if (*(char *)(lVar22 + uVar13) != '\0') {
              if (iVar20 == 6) {
                uVar15 = *(uint *)(lVar1 + -4 + uVar13 * 4);
                *(uint *)(lVar1 + uVar13 * 4) = uVar15;
                uVar21 = 6;
                if (((uVar17 == 0) || (lVar9 <= (long)(uVar13 + 1))) ||
                   (*(char *)(lVar19 + uVar13 + 1) == '\0')) {
                  iVar20 = 6;
                }
                else {
LAB_001b3716:
                  RemSP::Merge(uVar15,*(uint *)(lVar16 + 4 + uVar13 * 4));
                  iVar20 = 5;
                }
              }
              else {
                uVar21 = 6;
                if (iVar20 == 5) goto LAB_001b35ff;
              }
              goto LAB_001b38f3;
            }
            goto LAB_001b35ad;
          case 8:
            if (*(char *)(lVar22 + uVar13) != '\0') {
              uVar21 = 8;
              goto LAB_001b355c;
            }
LAB_001b35ad:
            uVar21 = 1;
            if ((uVar12 < uVar14) && (*(char *)(lVar18 + uVar13) != '\0')) {
              *(undefined4 *)(lVar2 + uVar13 * 4) =
                   *(undefined4 *)(lVar7 + lVar8 * uVar17 + -4 + uVar13 * 4);
LAB_001b35d7:
              uVar21 = 7;
            }
            break;
          case 9:
            if (*(char *)(lVar22 + uVar13) != '\0') {
              if (uVar17 == 0) goto LAB_001b35e2;
              if (*(char *)(lVar19 + uVar13) != '\0') goto LAB_001b34db;
              if (((long)(uVar13 + 1) < lVar9) && (*(char *)(lVar19 + uVar13 + 1) != '\0'))
              goto LAB_001b385a;
              iVar20 = 6;
              lVar11 = uVar13 - 1;
              uVar15 = *(uint *)(lVar2 + lVar11 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar15;
              if ((uVar13 != 0) && (*(char *)(lVar19 + lVar11) != '\0')) {
                j = *(uint *)(lVar16 + lVar11 * 4);
                goto LAB_001b394e;
              }
              goto LAB_001b35f4;
            }
LAB_001b351e:
            uVar21 = 1;
            if ((uVar12 < uVar14) && (*(char *)(lVar18 + uVar13) != '\0')) {
              *(undefined4 *)(lVar2 + uVar13 * 4) = *(undefined4 *)(lVar2 + -4 + uVar13 * 4);
              uVar21 = 9;
            }
            break;
          case 0xffffffff:
            if (*(char *)(lVar22 + uVar13) != '\0') {
              if (uVar17 == 0) {
LAB_001b377c:
                RemSP::P_[RemSP::length_] = RemSP::length_;
                iVar20 = 6;
                uVar15 = RemSP::length_;
                RemSP::length_ = RemSP::length_ + 1;
              }
              else if (*(char *)(lVar19 + uVar13) == '\0') {
                if ((lVar9 <= (long)(uVar13 + 1)) || (*(char *)(lVar19 + uVar13 + 1) == '\0'))
                goto LAB_001b377c;
                iVar20 = 5;
                uVar15 = *(uint *)(lVar16 + 4 + uVar13 * 4);
              }
              else {
                iVar20 = 4;
                uVar15 = *(uint *)(lVar16 + uVar13 * 4);
              }
              *(uint *)(lVar1 + uVar13 * 4) = uVar15;
              uVar21 = 2;
              if ((uVar12 < uVar14) && (*(char *)(lVar18 + uVar13) != '\0')) {
                *(uint *)(lVar2 + uVar13 * 4) = uVar15;
              }
              break;
            }
            uVar21 = 1;
            if ((uVar14 <= uVar12) || (*(char *)(lVar18 + uVar13) == '\0')) break;
            RemSP::P_[RemSP::length_] = RemSP::length_;
            uVar15 = RemSP::length_ + 1;
            *(uint *)(lVar2 + uVar13 * 4) = RemSP::length_;
            RemSP::length_ = uVar15;
            goto LAB_001b35d7;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar4);
      }
      uVar17 = uVar17 + 2;
    } while ((int)uVar17 < iVar3);
  }
  return;
}

Assistant:

void FirstScan() 
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
            unsigned int* const img_labels_row_fol = (unsigned int *)(((char *)img_labels_row) + img_labels_.step.p[0]);

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img_row[c]>0
#define CONDITION_B r+1<h && img_row_fol[c]>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_N2 r-1>=0 && img_row_prev[c]>0
#define CONDITION_N3 r-1>=0 && c+1<w && img_row_prev[c+1]>0
#define CONDITION_N4 c-1>=0 && img_row[c-1]>0
#define CONDITION_N5 c-1>=0 && r+1<h && img_row_fol[c-1]>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // a <- n1
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // a <- n2
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // a <- n3
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // a <- n4
#define ACTION_7 img_labels_row[c] = img_labels_row_fol[c - 1]; // a <- n5
#define ACTION_8 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c - 1]); // a + n1
#define ACTION_9 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c + 1]); // a + n3
#define ACTION_10 LabelsSolver::Merge(img_labels_row[c], img_labels_row_fol[c - 1]); // a + n5
#define ACTION_11 img_labels_row_fol[c] = LabelsSolver::NewLabel(); // b new label
#define ACTION_12 img_labels_row_fol[c] = img_labels_row[c - 1]; // b <- n4
#define ACTION_13 img_labels_row_fol[c] = img_labels_row_fol[c - 1]; // b <- n5
#define ACTION_14 img_labels_row_fol[c] = img_labels_row[c]; // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5
    }